

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

ostream * operator<<(ostream *out,BigInteger *a)

{
  ostream *poVar1;
  string local_30;
  
  BigInteger::toString_abi_cxx11_(&local_30,a);
  poVar1 = std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const BigInteger &a)
{
    return out << a.toString();
}